

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O1

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCompExp *expression)

{
  IExpression *pIVar1;
  ISubtreeWrapper *pIVar2;
  ISubtreeWrapper *pIVar3;
  ISubtreeWrapper *pIVar4;
  ISubtreeWrapper IVar5;
  ISubtreeWrapper IVar6;
  ISubtreeWrapper *pIVar7;
  ISubtreeWrapper local_40;
  ISubtreeWrapper local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CCompExp\n",0x16);
  pIVar1 = (expression->leftOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  pIVar2 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar1 = (expression->rightOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  pIVar3 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  if (expression->operation == LESS) {
    pIVar7 = (ISubtreeWrapper *)operator_new(0x20);
    (**pIVar2->_vptr_ISubtreeWrapper)(&local_40,pIVar2);
    IVar5._vptr_ISubtreeWrapper = local_40._vptr_ISubtreeWrapper;
    local_40._vptr_ISubtreeWrapper = (_func_int **)0x0;
    (**pIVar3->_vptr_ISubtreeWrapper)(&local_38,pIVar3);
    IVar6._vptr_ISubtreeWrapper = local_38._vptr_ISubtreeWrapper;
    local_38._vptr_ISubtreeWrapper = (_func_int **)0x0;
    pIVar7->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_00183560;
    *(undefined1 *)&pIVar7[1]._vptr_ISubtreeWrapper = 2;
    pIVar7[2]._vptr_ISubtreeWrapper = IVar5._vptr_ISubtreeWrapper;
    pIVar7[3]._vptr_ISubtreeWrapper = IVar6._vptr_ISubtreeWrapper;
    pIVar4 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar7;
    if (pIVar4 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar4);
    }
    if (local_38._vptr_ISubtreeWrapper != (_func_int **)0x0) {
      (**(code **)(*local_38._vptr_ISubtreeWrapper + 0x10))();
    }
    if (local_40._vptr_ISubtreeWrapper != (_func_int **)0x0) {
      (**(code **)(*local_40._vptr_ISubtreeWrapper + 0x10))();
    }
  }
  if (expression->operation == GREATER) {
    pIVar7 = (ISubtreeWrapper *)operator_new(0x20);
    (**pIVar2->_vptr_ISubtreeWrapper)(&local_40,pIVar2);
    IVar5._vptr_ISubtreeWrapper = local_40._vptr_ISubtreeWrapper;
    local_40._vptr_ISubtreeWrapper = (_func_int **)0x0;
    (**pIVar3->_vptr_ISubtreeWrapper)(&local_38,pIVar3);
    IVar6._vptr_ISubtreeWrapper = local_38._vptr_ISubtreeWrapper;
    local_38._vptr_ISubtreeWrapper = (_func_int **)0x0;
    pIVar7->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_00183560;
    *(undefined1 *)&pIVar7[1]._vptr_ISubtreeWrapper = 3;
    pIVar7[2]._vptr_ISubtreeWrapper = IVar5._vptr_ISubtreeWrapper;
    pIVar7[3]._vptr_ISubtreeWrapper = IVar6._vptr_ISubtreeWrapper;
    pIVar4 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar7;
    if (pIVar4 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar4);
    }
    if (local_38._vptr_ISubtreeWrapper != (_func_int **)0x0) {
      (**(code **)(*local_38._vptr_ISubtreeWrapper + 0x10))();
    }
    if (local_40._vptr_ISubtreeWrapper != (_func_int **)0x0) {
      (**(code **)(*local_40._vptr_ISubtreeWrapper + 0x10))();
    }
  }
  if (pIVar3 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar3);
  }
  if (pIVar2 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar2);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CCompExp &expression ) {
    std::cout << "IRT builder: CCompExp\n";
    expression.leftOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperLeft = std::move( wrapper );

    expression.rightOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperRight = std::move( wrapper );

    if ( expression.operation == enums::TCompareOperation::LESS ) {
        updateSubtreeWrapper( new IRT::CRelativeConditionalWrapper(
                IRT::enums::TLogicOperator::LESS,
                std::move( wrapperLeft->ToExpression( )),
                std::move( wrapperRight->ToExpression( ))
        ));
    }

    if ( expression.operation == enums::TCompareOperation::GREATER ) {
        updateSubtreeWrapper( new IRT::CRelativeConditionalWrapper(
                IRT::enums::TLogicOperator::GREATER,
                std::move( wrapperLeft->ToExpression( )),
                std::move( wrapperRight->ToExpression( ))
        ));
    }
}